

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonExtractFunc(sqlite3_context *ctx,int argc,sqlite3_value **argv)

{
  byte *pbVar1;
  uint uVar2;
  sqlite3_value *psVar3;
  char *pcVar4;
  void *pvVar5;
  uint N;
  u32 uVar6;
  JsonParse *pParse;
  uchar *z;
  ulong uVar7;
  Mem *pMVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  undefined1 local_c0 [48];
  undefined1 *local_90;
  undefined1 *puStack_88;
  undefined1 *local_80;
  undefined1 *puStack_78;
  undefined1 *local_70;
  undefined1 *puStack_68;
  undefined1 *local_60;
  undefined1 *puStack_58;
  undefined1 *local_50;
  undefined1 *puStack_48;
  undefined1 *local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if ((1 < argc) && (pParse = jsonParseFuncArg(ctx,*argv,0), pParse != (JsonParse *)0x0)) {
    local_40 = &DAT_aaaaaaaaaaaaaaaa;
    local_50 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_48 = &DAT_aaaaaaaaaaaaaaaa;
    local_60 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_58 = &DAT_aaaaaaaaaaaaaaaa;
    local_70 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_68 = &DAT_aaaaaaaaaaaaaaaa;
    local_80 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_78 = &DAT_aaaaaaaaaaaaaaaa;
    local_90 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_88 = &DAT_aaaaaaaaaaaaaaaa;
    local_c0._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
    pvVar5 = ctx->pFunc->pUserData;
    local_c0._8_8_ = local_c0 + 0x22;
    local_c0._16_8_ = 100;
    local_c0._24_8_ = 0;
    local_c0[0x20] = '\x01';
    local_c0[0x21] = '\0';
    local_c0[0x22] = -0x56;
    local_c0[0x23] = -0x56;
    local_c0[0x24] = -0x56;
    local_c0[0x25] = -0x56;
    local_c0[0x26] = -0x56;
    local_c0[0x27] = -0x56;
    local_c0._0_8_ = ctx;
    if (argc != 2) {
      jsonAppendChar((JsonString *)local_c0,'[');
    }
    for (uVar9 = 1; uVar9 < (uint)argc; uVar9 = uVar9 + 1) {
      z = sqlite3_value_text(argv[uVar9]);
      if (z == (uchar *)0x0) goto LAB_001a1af6;
      N = sqlite3Strlen30((char *)z);
      if (*z != '$') {
        if (((ulong)pvVar5 & 3) != 0) {
          local_c0._8_8_ = local_c0 + 0x22;
          local_c0._16_8_ = 100;
          local_c0._24_8_ = 0;
          local_c0._32_2_ = 1;
          psVar3 = argv[uVar9];
          uVar2._0_2_ = psVar3->flags;
          uVar2._2_1_ = psVar3->enc;
          uVar2._3_1_ = psVar3->eSubtype;
          if ((0x50505050UL >> ((ulong)uVar2 & 0x3f) & 1) == 0) {
            for (uVar7 = 0; N != uVar7; uVar7 = uVar7 + 1) {
              if (((ulong)z[uVar7] != 0x5f) && ((""[z[uVar7]] & 6) == 0)) {
                if (N != (uint)uVar7) {
                  if ((2 < N && *z == '[') && (local_c0._0_8_ = ctx, z[(ulong)N - 1] == ']'))
                  goto LAB_001a1910;
                  local_c0._0_8_ = ctx;
                  jsonAppendRawNZ((JsonString *)local_c0,".\"",2);
                  jsonAppendRaw((JsonString *)local_c0,(char *)z,N);
                  pcVar4 = ".\"";
                  uVar6 = 1;
                  goto LAB_001a18ed;
                }
                break;
              }
            }
            local_c0._0_8_ = ctx;
            jsonAppendRawNZ((JsonString *)local_c0,".",1);
LAB_001a1910:
            jsonAppendRaw((JsonString *)local_c0,(char *)z,N);
          }
          else {
            local_c0._0_8_ = ctx;
            jsonAppendRawNZ((JsonString *)local_c0,"[",1);
            if (*z == '-') {
              jsonAppendRawNZ((JsonString *)local_c0,"#",1);
            }
            jsonAppendRaw((JsonString *)local_c0,(char *)z,N);
            pcVar4 = "[]";
            uVar6 = 2;
LAB_001a18ed:
            jsonAppendRawNZ((JsonString *)local_c0,pcVar4 + 1,uVar6);
          }
          jsonStringTerminate((JsonString *)local_c0);
          uVar6 = jsonLookupStep(pParse,0,(char *)local_c0._8_8_,0);
          jsonStringReset((JsonString *)local_c0);
          goto LAB_001a1942;
        }
LAB_001a1ae9:
        jsonBadPathError(ctx,(char *)z);
        goto LAB_001a1af6;
      }
      uVar6 = jsonLookupStep(pParse,0,(char *)(z + 1),0);
LAB_001a1942:
      if (uVar6 < pParse->nBlob) {
        if (argc == 2) {
          if (((ulong)pvVar5 & 1) == 0) {
            jsonReturnFromBlob(pParse,uVar6,ctx,0);
            if ((((ulong)pvVar5 & 10) != 0) || ((pParse->aBlob[uVar6] & 0xf) < 0xb))
            goto LAB_001a19da;
            pMVar8 = ctx->pOut;
          }
          else {
            local_c0._8_8_ = local_c0 + 0x22;
            local_c0._16_8_ = 100;
            local_c0._24_8_ = 0;
            local_c0._32_2_ = 1;
            local_c0._0_8_ = ctx;
            jsonTranslateBlobToText(pParse,uVar6,(JsonString *)local_c0);
            jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
            jsonStringReset((JsonString *)local_c0);
            pMVar8 = ctx->pOut;
          }
          pMVar8->eSubtype = 'J';
          pbVar1 = (byte *)((long)&pMVar8->flags + 1);
          *pbVar1 = *pbVar1 | 8;
        }
        else {
          jsonAppendSeparator((JsonString *)local_c0);
          jsonTranslateBlobToText(pParse,uVar6,(JsonString *)local_c0);
        }
      }
      else {
        if (uVar6 != 0xfffffffe) {
          if (uVar6 != 0xffffffff) goto LAB_001a1ae9;
          sqlite3_result_error(ctx,"malformed JSON",-1);
          goto LAB_001a1af6;
        }
        if (argc == 2) goto LAB_001a1af6;
        jsonAppendSeparator((JsonString *)local_c0);
        jsonAppendRawNZ((JsonString *)local_c0,"null",4);
      }
LAB_001a19da:
    }
    if (argc != 2) {
      jsonAppendChar((JsonString *)local_c0,']');
      jsonReturnString((JsonString *)local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
      if (((ulong)pvVar5 & 8) == 0) {
        pMVar8 = ctx->pOut;
        pMVar8->eSubtype = 'J';
        pbVar1 = (byte *)((long)&pMVar8->flags + 1);
        *pbVar1 = *pbVar1 | 8;
      }
    }
LAB_001a1af6:
    jsonStringReset((JsonString *)local_c0);
    jsonParseFree(pParse);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

static void jsonExtractFunc(
  sqlite3_context *ctx,
  int argc,
  sqlite3_value **argv
){
  JsonParse *p = 0;      /* The parse */
  int flags;             /* Flags associated with the function */
  int i;                 /* Loop counter */
  JsonString jx;         /* String for array result */

  if( argc<2 ) return;
  p = jsonParseFuncArg(ctx, argv[0], 0);
  if( p==0 ) return;
  flags = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  jsonStringInit(&jx, ctx);
  if( argc>2 ){
    jsonAppendChar(&jx, '[');
  }
  for(i=1; i<argc; i++){
    /* With a single PATH argument */
    const char *zPath = (const char*)sqlite3_value_text(argv[i]);
    int nPath;
    u32 j;
    if( zPath==0 ) goto json_extract_error;
    nPath = sqlite3Strlen30(zPath);
    if( zPath[0]=='$' ){
      j = jsonLookupStep(p, 0, zPath+1, 0);
    }else if( (flags & JSON_ABPATH) ){
      /* The -> and ->> operators accept abbreviated PATH arguments.  This
      ** is mostly for compatibility with PostgreSQL, but also for
      ** convenience.
      **
      **     NUMBER   ==>  $[NUMBER]     // PG compatible
      **     LABEL    ==>  $.LABEL       // PG compatible
      **     [NUMBER] ==>  $[NUMBER]     // Not PG.  Purely for convenience
      **
      ** Updated 2024-05-27:  If the NUMBER is negative, then PG counts from
      ** the right of the array.  Hence for negative NUMBER:
      **
      **     NUMBER   ==>  $[#NUMBER]    // PG compatible
      */
      jsonStringInit(&jx, ctx);
      if( sqlite3_value_type(argv[i])==SQLITE_INTEGER ){
        jsonAppendRawNZ(&jx, "[", 1);
        if( zPath[0]=='-' ) jsonAppendRawNZ(&jx,"#",1);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "]", 2);
      }else if( jsonAllAlphanum(zPath, nPath) ){
        jsonAppendRawNZ(&jx, ".", 1);
        jsonAppendRaw(&jx, zPath, nPath);
      }else if( zPath[0]=='[' && nPath>=3 && zPath[nPath-1]==']' ){
        jsonAppendRaw(&jx, zPath, nPath);
      }else{
        jsonAppendRawNZ(&jx, ".\"", 2);
        jsonAppendRaw(&jx, zPath, nPath);
        jsonAppendRawNZ(&jx, "\"", 1);
      }
      jsonStringTerminate(&jx);
      j = jsonLookupStep(p, 0, jx.zBuf, 0);
      jsonStringReset(&jx);
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
    if( j<p->nBlob ){
      if( argc==2 ){
        if( flags & JSON_JSON ){
          jsonStringInit(&jx, ctx);
          jsonTranslateBlobToText(p, j, &jx);
          jsonReturnString(&jx, 0, 0);
          jsonStringReset(&jx);
          assert( (flags & JSON_BLOB)==0 );
          sqlite3_result_subtype(ctx, JSON_SUBTYPE);
        }else{
          jsonReturnFromBlob(p, j, ctx, 0);
          if( (flags & (JSON_SQL|JSON_BLOB))==0
           && (p->aBlob[j]&0x0f)>=JSONB_ARRAY
          ){
            sqlite3_result_subtype(ctx, JSON_SUBTYPE);
          }
        }
      }else{
        jsonAppendSeparator(&jx);
        jsonTranslateBlobToText(p, j, &jx);
      }
    }else if( j==JSON_LOOKUP_NOTFOUND ){
      if( argc==2 ){
        goto json_extract_error;  /* Return NULL if not found */
      }else{
        jsonAppendSeparator(&jx);
        jsonAppendRawNZ(&jx, "null", 4);
      }
    }else if( j==JSON_LOOKUP_ERROR ){
      sqlite3_result_error(ctx, "malformed JSON", -1);
      goto json_extract_error;
    }else{
      jsonBadPathError(ctx, zPath);
      goto json_extract_error;
    }
  }
  if( argc>2 ){
    jsonAppendChar(&jx, ']');
    jsonReturnString(&jx, 0, 0);
    if( (flags & JSON_BLOB)==0 ){
      sqlite3_result_subtype(ctx, JSON_SUBTYPE);
    }
  }
json_extract_error:
  jsonStringReset(&jx);
  jsonParseFree(p);
  return;
}